

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
backend::codegen::Codegen::emit_compare
          (Codegen *this,VarId *dest,Value *lhs,Value *rhs,ConditionCode cond,bool reversed)

{
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_00;
  undefined3 in_register_00000089;
  _Head_base<0UL,_arm::Inst_*,_false> local_90;
  _Head_base<0UL,_arm::Arith2Inst_*,_false> local_88;
  undefined1 local_80 [16];
  Operand2 local_70;
  VarId local_50;
  VarId local_40;
  
  local_80._8_8_ = dest;
  if (CONCAT31(in_register_00000089,reversed) != 0) {
    arm::reverse_cond(cond);
  }
  this_00 = &this->inst;
  local_80._4_4_ = 0x18;
  local_80._0_4_ = translate_value_to_reg(this,lhs);
  translate_value_to_operand2(&local_70,this,rhs);
  std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
            ((OpCode *)&local_88,(uint *)(local_80 + 4),(Operand2 *)local_80);
  local_90._M_head_impl = &(local_88._M_head_impl)->super_Inst;
  local_88._M_head_impl = (Arith2Inst *)0x0;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_90);
  if ((Arith2Inst *)local_90._M_head_impl != (Arith2Inst *)0x0) {
    (*(((Inst *)&(local_90._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
      [2])();
  }
  local_90._M_head_impl = (Inst *)0x0;
  std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_88);
  local_80._4_4_ = 6;
  local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_40.id = *(uint32_t *)(local_80._8_8_ + 8);
  local_80._0_4_ = translate_var_reg(this,&local_40);
  local_70.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest = (_Variadic_union<int>)0x0;
  local_70.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index = '\x01';
  local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001db830;
  std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
            ((OpCode *)&local_88,(uint *)(local_80 + 4),(Operand2 *)local_80);
  local_90._M_head_impl = &(local_88._M_head_impl)->super_Inst;
  local_88._M_head_impl = (Arith2Inst *)0x0;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_90);
  if ((Arith2Inst *)local_90._M_head_impl != (Arith2Inst *)0x0) {
    (*(((Inst *)&(local_90._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
      [2])();
  }
  local_90._M_head_impl = (Inst *)0x0;
  std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_88);
  local_80._4_4_ = 6;
  local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_50.id = *(uint32_t *)(local_80._8_8_ + 8);
  local_80._0_4_ = translate_var_reg(this,&local_50);
  local_70.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u._M_rest = (_Variadic_union<int>)0x1;
  local_70.super_variant<arm::RegisterOperand,_int>.super__Variant_base<arm::RegisterOperand,_int>.
  super__Move_assign_alias<arm::RegisterOperand,_int>.
  super__Copy_assign_alias<arm::RegisterOperand,_int>.
  super__Move_ctor_alias<arm::RegisterOperand,_int>.
  super__Copy_ctor_alias<arm::RegisterOperand,_int>.
  super__Variant_storage_alias<arm::RegisterOperand,_int>._M_index = '\x01';
  local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001db830;
  std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2,arm::ConditionCode&>
            ((OpCode *)&local_88,(uint *)(local_80 + 4),(Operand2 *)local_80,
             (ConditionCode *)&local_70);
  local_90._M_head_impl = &(local_88._M_head_impl)->super_Inst;
  local_88._M_head_impl = (Arith2Inst *)0x0;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)this_00,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_90);
  if ((Arith2Inst *)local_90._M_head_impl != (Arith2Inst *)0x0) {
    (*(((Inst *)&(local_90._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
      [2])();
  }
  local_90._M_head_impl = (Inst *)0x0;
  std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_88);
  return;
}

Assistant:

void Codegen::emit_compare(mir::inst::VarId& dest, mir::inst::Value& lhs,
                           mir::inst::Value& rhs, arm::ConditionCode cond,
                           bool reversed) {
  if (reversed) {
    cond = reverse_cond(cond);
  }
  inst.push_back(
      std::make_unique<Arith2Inst>(OpCode::Cmp, translate_value_to_reg(lhs),
                                   translate_value_to_operand2(rhs)));

  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(0)));
  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(1), cond));
}